

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::ConstantPaddingLayerParams::_InternalParse
          (ConstantPaddingLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  float *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = (float *)ptr;
LAB_0021342c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) {
      return (char *)local_48;
    }
    local_48 = (float *)google::protobuf::internal::ReadTag((char *)local_48,&local_3c,0);
    tag_00 = local_3c;
    uVar3 = local_3c >> 3;
    cVar4 = (char)local_3c;
    if (uVar3 == 3) {
      if (cVar4 == '\x18') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        this->padtogivenoutputsizemode_ = uVar2 != 0;
        goto joined_r0x0021350f;
      }
LAB_002134dc:
      if ((local_3c == 0) || ((local_3c & 7) == 4)) {
        if (local_48 == (float *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        return (char *)local_48;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_38);
      local_48 = (float *)google::protobuf::internal::UnknownFieldParse
                                    (tag_00,unknown,(char *)local_48,ctx);
    }
    else {
      if (uVar3 != 2) {
        if ((uVar3 != 1) || (cVar4 != '\r')) goto LAB_002134dc;
        this->value_ = *local_48;
        local_48 = local_48 + 1;
        goto LAB_0021342c;
      }
      if (cVar4 == '\x12') {
        local_48 = (float *)google::protobuf::internal::PackedUInt64Parser
                                      (&this->padamounts_,(char *)local_48,ctx);
      }
      else {
        if ((local_3c & 0xff) != 0x10) goto LAB_002134dc;
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        _internal_add_padamounts(this,uVar2);
      }
    }
joined_r0x0021350f:
    if (local_48 == (float *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ConstantPaddingLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // float value = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 13)) {
          value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // repeated uint64 padAmounts = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_padamounts(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 16) {
          _internal_add_padamounts(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool padToGivenOutputSizeMode = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          padtogivenoutputsizemode_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}